

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_morton.h
# Opt level: O3

BVHNodeRecord<embree::NodeRefPtr<4>_> * __thiscall
embree::sse2::BVHBuilderMorton::
BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::sse2::SetBVHNBounds<4>,_embree::sse2::CreateMortonLeaf<4,_embree::TriangleMi<4>_>,_embree::sse2::CalculateMeshBounds<embree::TriangleMesh>,_embree::Scene::BuildProgressMonitorInterface>
::createLargeLeaf(BVHNodeRecord<embree::NodeRefPtr<4>_> *__return_storage_ptr__,
                 BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::sse2::SetBVHNBounds<4>,_embree::sse2::CreateMortonLeaf<4,_embree::TriangleMi<4>_>,_embree::sse2::CalculateMeshBounds<embree::TriangleMesh>,_embree::Scene::BuildProgressMonitorInterface>
                 *this,size_t depth,range<unsigned_int> *current,CachedAllocator alloc)

{
  atomic<unsigned_long> *paVar1;
  pointer *pppTVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ThreadLocal2 *this_00;
  iterator __position;
  undefined8 *puVar5;
  CachedAllocator alloc_00;
  FastAllocator *this_01;
  ThreadLocal *pTVar6;
  undefined8 this_02;
  BVHNodeRecord<embree::NodeRefPtr<4>_> *pBVar7;
  undefined1 (*pauVar8) [16];
  int *piVar9;
  size_t sVar10;
  undefined8 *puVar11;
  ulong uVar12;
  range<unsigned_int> rVar13;
  range<unsigned_int> *current_00;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  range<unsigned_int> rVar17;
  uint uVar18;
  ulong uVar19;
  range<unsigned_int> rVar20;
  ulong uVar21;
  ulong uVar22;
  char *pcVar23;
  ulong uVar24;
  undefined1 auVar25 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar26;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar27;
  range<unsigned_int> children [8];
  BVHNodeRecord<embree::NodeRefPtr<4>_> bounds [8];
  undefined8 *local_258;
  ThreadLocal2 *local_250;
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_248;
  BVHNodeRecord<embree::NodeRefPtr<4>_> *local_230;
  BVHNodeRecord<embree::NodeRefPtr<4>_> local_228;
  range<unsigned_int> local_1f8 [8];
  undefined8 *local_1b8;
  undefined1 local_1b0;
  undefined7 uStack_1af;
  undefined8 local_1a8;
  int iStack_19c;
  undefined8 local_198 [45];
  
  local_248._8_8_ = local_248._0_8_;
  this_01 = alloc.alloc;
  pTVar6 = alloc.talloc0;
  if ((this->super_Settings).maxDepth < depth) {
    puVar11 = (undefined8 *)__cxa_allocate_exception(0x30);
    local_1b8 = &local_1a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"depth limit reached","");
    *puVar11 = &PTR__rtcore_error_02184a18;
    *(undefined4 *)(puVar11 + 1) = 1;
    puVar11[2] = puVar11 + 4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar11 + 2),local_1b8,(long)local_1b8 + CONCAT71(uStack_1af,local_1b0));
    __cxa_throw(puVar11,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
  }
  uVar22 = (this->super_Settings).maxLeafSize;
  if (current->_end - current->_begin <= uVar22) {
    CreateMortonLeaf<4,_embree::TriangleMi<4>_>::operator()
              (__return_storage_ptr__,this->createLeaf,current,&alloc);
    return __return_storage_ptr__;
  }
  local_1f8[0] = *current;
  uVar24 = (this->super_Settings).branchingFactor;
  uVar12 = 2;
  if (2 < uVar24) {
    uVar12 = uVar24;
  }
  uVar24 = 1;
  rVar13 = *current;
  do {
    uVar15 = 0;
    uVar19 = 0;
    uVar16 = 0xffffffffffffffff;
    do {
      uVar21 = (ulong)(local_1f8[uVar15]._end - local_1f8[uVar15]._begin);
      uVar14 = uVar15;
      if (uVar21 <= uVar22 || uVar21 <= uVar19) {
        uVar14 = uVar16;
        uVar21 = uVar19;
      }
      uVar19 = uVar21;
      uVar15 = uVar15 + 1;
      uVar16 = uVar14;
    } while (uVar24 != uVar15);
    uVar16 = uVar24;
    if (uVar14 == 0xffffffffffffffff) break;
    uVar18 = local_1f8[uVar14]._end + local_1f8[uVar14]._begin >> 1;
    rVar17._end = local_1f8[uVar14]._end;
    rVar17._begin = uVar18;
    rVar20._end = uVar18;
    rVar20._begin = local_1f8[uVar14]._begin;
    local_1f8[uVar14] = rVar13;
    local_1f8[uVar24 - 1] = rVar20;
    local_1f8[uVar24] = rVar17;
    uVar24 = uVar24 + 1;
    rVar13 = rVar17;
    uVar16 = uVar12;
  } while (uVar24 != uVar12);
  local_258 = (undefined8 *)0x80;
  this_00 = (alloc.talloc0)->parent;
  if (alloc.alloc != (this_00->alloc)._M_b._M_p) {
    local_228._8_1_ = '\x01';
    local_228.ref.ptr = (size_t)this_00;
    MutexSys::lock(&this_00->mutex);
    if ((this_00->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_00->alloc1).bytesUsed + (this_00->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_00->alloc0).end + (this_00->alloc1).end) -
           ((this_00->alloc0).cur + (this_00->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_00->alloc1).bytesWasted + (this_00->alloc0).bytesWasted;
      UNLOCK();
    }
    (this_00->alloc0).bytesUsed = 0;
    (this_00->alloc0).bytesWasted = 0;
    (this_00->alloc0).end = 0;
    (this_00->alloc0).allocBlockSize = 0;
    (this_00->alloc0).ptr = (char *)0x0;
    (this_00->alloc0).cur = 0;
    if (this_01 == (FastAllocator *)0x0) {
      (this_00->alloc1).bytesUsed = 0;
      (this_00->alloc1).bytesWasted = 0;
      (this_00->alloc1).end = 0;
      (this_00->alloc1).allocBlockSize = 0;
      (this_00->alloc1).ptr = (char *)0x0;
      (this_00->alloc1).cur = 0;
    }
    else {
      (this_00->alloc0).allocBlockSize = this_01->defaultBlockSize;
      (this_00->alloc1).ptr = (char *)0x0;
      (this_00->alloc1).cur = 0;
      (this_00->alloc1).end = 0;
      (this_00->alloc1).allocBlockSize = 0;
      (this_00->alloc1).bytesUsed = 0;
      (this_00->alloc1).bytesWasted = 0;
      (this_00->alloc1).allocBlockSize = this_01->defaultBlockSize;
    }
    LOCK();
    (this_00->alloc)._M_b._M_p = this_01;
    UNLOCK();
    local_1b8 = &FastAllocator::s_thread_local_allocators_lock;
    local_1b0 = 1;
    local_250 = this_00;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    __position._M_current =
         (this_01->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this_01->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&this_01->thread_local_allocators,__position,&local_250);
    }
    else {
      *__position._M_current = local_250;
      pppTVar2 = &(this_01->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar2 = *pppTVar2 + 1;
    }
    MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    if (local_228._8_1_ == '\x01') {
      MutexSys::unlock((MutexSys *)local_228.ref.ptr);
    }
  }
  puVar11 = local_258;
  pTVar6->bytesUsed = pTVar6->bytesUsed + (long)local_258;
  sVar10 = pTVar6->cur;
  uVar22 = (ulong)(-(int)sVar10 & 0xf);
  uVar24 = (long)local_258 + uVar22 + sVar10;
  pTVar6->cur = uVar24;
  local_248._0_8_ = this;
  local_230 = __return_storage_ptr__;
  if (pTVar6->end < uVar24) {
    pTVar6->cur = sVar10;
    puVar5 = (undefined8 *)pTVar6->allocBlockSize;
    if ((undefined8 *)((long)local_258 * 4) < puVar5 || (long)local_258 * 4 - (long)puVar5 == 0) {
      local_1b8 = puVar5;
      pcVar23 = (char *)FastAllocator::malloc(this_01,(size_t)&local_1b8);
      pTVar6->ptr = pcVar23;
      sVar10 = (pTVar6->end - pTVar6->cur) + pTVar6->bytesWasted;
      pTVar6->bytesWasted = sVar10;
      pTVar6->end = (size_t)local_1b8;
      pTVar6->cur = (size_t)puVar11;
      if (local_1b8 < puVar11) {
        pTVar6->cur = 0;
        local_1b8 = (undefined8 *)pTVar6->allocBlockSize;
        pcVar23 = (char *)FastAllocator::malloc(this_01,(size_t)&local_1b8);
        pTVar6->ptr = pcVar23;
        sVar10 = (pTVar6->end - pTVar6->cur) + pTVar6->bytesWasted;
        pTVar6->bytesWasted = sVar10;
        pTVar6->end = (size_t)local_1b8;
        pTVar6->cur = (size_t)puVar11;
        if (local_1b8 < puVar11) {
          pTVar6->cur = 0;
          pcVar23 = (char *)0x0;
          goto LAB_00be405b;
        }
      }
      pTVar6->bytesWasted = sVar10;
    }
    else {
      pcVar23 = (char *)FastAllocator::malloc(this_01,(size_t)&local_258);
    }
  }
  else {
    pTVar6->bytesWasted = pTVar6->bytesWasted + uVar22;
    pcVar23 = pTVar6->ptr + (uVar24 - (long)local_258);
  }
LAB_00be405b:
  pcVar23[0x60] = '\0';
  pcVar23[0x61] = '\0';
  pcVar23[0x62] = -0x80;
  pcVar23[99] = '\x7f';
  pcVar23[100] = '\0';
  pcVar23[0x65] = '\0';
  pcVar23[0x66] = -0x80;
  pcVar23[0x67] = '\x7f';
  pcVar23[0x68] = '\0';
  pcVar23[0x69] = '\0';
  pcVar23[0x6a] = -0x80;
  pcVar23[0x6b] = '\x7f';
  pcVar23[0x6c] = '\0';
  pcVar23[0x6d] = '\0';
  pcVar23[0x6e] = -0x80;
  pcVar23[0x6f] = '\x7f';
  pcVar23[0x40] = '\0';
  pcVar23[0x41] = '\0';
  pcVar23[0x42] = -0x80;
  pcVar23[0x43] = '\x7f';
  pcVar23[0x44] = '\0';
  pcVar23[0x45] = '\0';
  pcVar23[0x46] = -0x80;
  pcVar23[0x47] = '\x7f';
  pcVar23[0x48] = '\0';
  pcVar23[0x49] = '\0';
  pcVar23[0x4a] = -0x80;
  pcVar23[0x4b] = '\x7f';
  pcVar23[0x4c] = '\0';
  pcVar23[0x4d] = '\0';
  pcVar23[0x4e] = -0x80;
  pcVar23[0x4f] = '\x7f';
  pcVar23[0x20] = '\0';
  pcVar23[0x21] = '\0';
  pcVar23[0x22] = -0x80;
  pcVar23[0x23] = '\x7f';
  pcVar23[0x24] = '\0';
  pcVar23[0x25] = '\0';
  pcVar23[0x26] = -0x80;
  pcVar23[0x27] = '\x7f';
  pcVar23[0x28] = '\0';
  pcVar23[0x29] = '\0';
  pcVar23[0x2a] = -0x80;
  pcVar23[0x2b] = '\x7f';
  pcVar23[0x2c] = '\0';
  pcVar23[0x2d] = '\0';
  pcVar23[0x2e] = -0x80;
  pcVar23[0x2f] = '\x7f';
  pcVar23[0x70] = '\0';
  pcVar23[0x71] = '\0';
  pcVar23[0x72] = -0x80;
  pcVar23[0x73] = -1;
  pcVar23[0x74] = '\0';
  pcVar23[0x75] = '\0';
  pcVar23[0x76] = -0x80;
  pcVar23[0x77] = -1;
  pcVar23[0x78] = '\0';
  pcVar23[0x79] = '\0';
  pcVar23[0x7a] = -0x80;
  pcVar23[0x7b] = -1;
  pcVar23[0x7c] = '\0';
  pcVar23[0x7d] = '\0';
  pcVar23[0x7e] = -0x80;
  pcVar23[0x7f] = -1;
  pcVar23[0x50] = '\0';
  pcVar23[0x51] = '\0';
  pcVar23[0x52] = -0x80;
  pcVar23[0x53] = -1;
  pcVar23[0x54] = '\0';
  pcVar23[0x55] = '\0';
  pcVar23[0x56] = -0x80;
  pcVar23[0x57] = -1;
  pcVar23[0x58] = '\0';
  pcVar23[0x59] = '\0';
  pcVar23[0x5a] = -0x80;
  pcVar23[0x5b] = -1;
  pcVar23[0x5c] = '\0';
  pcVar23[0x5d] = '\0';
  pcVar23[0x5e] = -0x80;
  pcVar23[0x5f] = -1;
  pcVar23[0x30] = '\0';
  pcVar23[0x31] = '\0';
  pcVar23[0x32] = -0x80;
  pcVar23[0x33] = -1;
  pcVar23[0x34] = '\0';
  pcVar23[0x35] = '\0';
  pcVar23[0x36] = -0x80;
  pcVar23[0x37] = -1;
  pcVar23[0x38] = '\0';
  pcVar23[0x39] = '\0';
  pcVar23[0x3a] = -0x80;
  pcVar23[0x3b] = -1;
  pcVar23[0x3c] = '\0';
  pcVar23[0x3d] = '\0';
  pcVar23[0x3e] = -0x80;
  pcVar23[0x3f] = -1;
  pcVar23[0] = '\b';
  pcVar23[1] = '\0';
  pcVar23[2] = '\0';
  pcVar23[3] = '\0';
  pcVar23[4] = '\0';
  pcVar23[5] = '\0';
  pcVar23[6] = '\0';
  pcVar23[7] = '\0';
  pcVar23[8] = '\b';
  pcVar23[9] = '\0';
  pcVar23[10] = '\0';
  pcVar23[0xb] = '\0';
  pcVar23[0xc] = '\0';
  pcVar23[0xd] = '\0';
  pcVar23[0xe] = '\0';
  pcVar23[0xf] = '\0';
  pcVar23[0x10] = '\b';
  pcVar23[0x11] = '\0';
  pcVar23[0x12] = '\0';
  pcVar23[0x13] = '\0';
  pcVar23[0x14] = '\0';
  pcVar23[0x15] = '\0';
  pcVar23[0x16] = '\0';
  pcVar23[0x17] = '\0';
  pcVar23[0x18] = '\b';
  pcVar23[0x19] = '\0';
  pcVar23[0x1a] = '\0';
  pcVar23[0x1b] = '\0';
  pcVar23[0x1c] = '\0';
  pcVar23[0x1d] = '\0';
  pcVar23[0x1e] = '\0';
  pcVar23[0x1f] = '\0';
  current_00 = local_1f8;
  puVar11 = local_198;
  this_02 = local_248._0_8_;
  uVar22 = uVar16;
  do {
    alloc_00.talloc0 = alloc.talloc0;
    alloc_00.alloc = alloc.alloc;
    alloc_00.talloc1 = alloc.talloc1;
    createLargeLeaf(&local_228,
                    (BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::sse2::SetBVHNBounds<4>,_embree::sse2::CreateMortonLeaf<4,_embree::TriangleMi<4>_>,_embree::sse2::CalculateMeshBounds<embree::TriangleMesh>,_embree::Scene::BuildProgressMonitorInterface>
                     *)this_02,depth + 1,current_00,alloc_00);
    pBVar7 = local_230;
    puVar11[-4] = local_228.ref.ptr;
    puVar11[-2] = local_228.bounds.lower.field_0._0_8_;
    puVar11[-1] = local_228.bounds.lower.field_0._8_8_;
    *puVar11 = local_228.bounds.upper.field_0._0_8_;
    puVar11[1] = local_228.bounds.upper.field_0._8_8_;
    puVar11 = puVar11 + 6;
    current_00 = current_00 + 1;
    uVar22 = uVar22 - 1;
  } while (uVar22 != 0);
  pauVar8 = (undefined1 (*) [16])local_198;
  uVar22 = 0;
  auVar25 = _DAT_01f7a9f0;
  aVar27 = _DAT_01f7aa00;
  do {
    auVar3 = pauVar8[-1];
    auVar4 = *pauVar8;
    auVar25 = minps(auVar25,auVar3);
    aVar26._0_12_ = auVar25._0_12_;
    aVar27.m128 = (__m128)maxps(aVar27.m128,auVar4);
    *(undefined8 *)(pcVar23 + uVar22 * 8) = *(undefined8 *)pauVar8[-2];
    *(int *)(pcVar23 + uVar22 * 4 + 0x20) = auVar3._0_4_;
    *(int *)(pcVar23 + uVar22 * 4 + 0x40) = auVar3._4_4_;
    *(int *)(pcVar23 + uVar22 * 4 + 0x60) = auVar3._8_4_;
    *(int *)(pcVar23 + uVar22 * 4 + 0x30) = auVar4._0_4_;
    *(int *)(pcVar23 + uVar22 * 4 + 0x50) = auVar4._4_4_;
    *(int *)(pcVar23 + uVar22 * 4 + 0x70) = auVar4._8_4_;
    uVar22 = uVar22 + 1;
    pauVar8 = pauVar8 + 3;
  } while (uVar16 != uVar22);
  piVar9 = &iStack_19c;
  uVar24 = 0;
  uVar22 = uVar16;
  do {
    uVar24 = uVar24 + (long)*piVar9;
    piVar9 = piVar9 + 0xc;
    uVar22 = uVar22 - 1;
  } while (uVar22 != 0);
  if (0xfff < uVar24) {
    piVar9 = &iStack_19c;
    uVar22 = 0;
    local_248 = aVar27;
    do {
      if (*piVar9 < 0x1000) {
        BVHNRotate<4>::rotate((NodeRef)*(size_t *)(pcVar23 + uVar22 * 8),1);
        pcVar23[uVar22 * 8 + 7] = pcVar23[uVar22 * 8 + 7] | 0x80;
        aVar27 = local_248;
      }
      uVar22 = uVar22 + 1;
      piVar9 = piVar9 + 0xc;
    } while (uVar16 != uVar22);
  }
  aVar26.m128[3] = (float)(int)uVar24;
  (pBVar7->ref).ptr = (size_t)pcVar23;
  (pBVar7->bounds).lower.field_0 = aVar26;
  (pBVar7->bounds).upper.field_0 = aVar27;
  return pBVar7;
}

Assistant:

ReductionTy createLargeLeaf(size_t depth, const range<unsigned>& current, Allocator alloc)
        {
          /* this should never occur but is a fatal error */
          if (depth > maxDepth)
            throw_RTCError(RTC_ERROR_UNKNOWN,"depth limit reached");

          /* create leaf for few primitives */
          if (current.size() <= maxLeafSize)
            return createLeaf(current,alloc);

          /* fill all children by always splitting the largest one */
          range<unsigned> children[MAX_BRANCHING_FACTOR];
          size_t numChildren = 1;
          children[0] = current;

          do {

            /* find best child with largest number of primitives */
            size_t bestChild = -1;
            size_t bestSize = 0;
            for (size_t i=0; i<numChildren; i++)
            {
              /* ignore leaves as they cannot get split */
              if (children[i].size() <= maxLeafSize)
                continue;

              /* remember child with largest size */
              if (children[i].size() > bestSize) {
                bestSize = children[i].size();
                bestChild = i;
              }
            }
            if (bestChild == size_t(-1)) break;

            /*! split best child into left and right child */
            auto split = children[bestChild].split();

            /* add new children left and right */
            children[bestChild] = children[numChildren-1];
            children[numChildren-1] = split.first;
            children[numChildren+0] = split.second;
            numChildren++;

          } while (numChildren < branchingFactor);

          /* create node */
          auto node = createNode(alloc,numChildren);

          /* recurse into each child */
          ReductionTy bounds[MAX_BRANCHING_FACTOR];
          for (size_t i=0; i<numChildren; i++)
            bounds[i] = createLargeLeaf(depth+1,children[i],alloc);

          return setBounds(node,bounds,numChildren);
        }